

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concat_ws.cpp
# Opt level: O2

void duckdb::TemplatedConcatWS
               (DataChunk *args,string_t *sep_data,SelectionVector *sep_sel,SelectionVector *rsel,
               idx_t count,Vector *result)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  bool bVar4;
  reference this;
  reference pvVar5;
  long lVar6;
  pointer pVVar7;
  idx_t len;
  idx_t i_1;
  long lVar8;
  size_type sVar9;
  void *__src;
  long lVar10;
  pointer pVVar11;
  char *__src_00;
  size_type sVar12;
  idx_t i;
  size_type sVar13;
  long lVar14;
  size_type row_idx;
  char *pcVar15;
  idx_t col_idx;
  ulong uVar16;
  data_ptr_t pdVar17;
  reference rVar18;
  string_t sVar19;
  unique_ptr<duckdb::UnifiedVectorFormat[],_std::default_delete<duckdb::UnifiedVectorFormat>,_false>
  orrified_data;
  allocator_type local_d1;
  data_ptr_t local_d0;
  SelectionVector *local_c8;
  size_type local_c0;
  char *local_b8;
  uint local_ac;
  vector<unsigned_long,_true> result_lengths;
  vector<bool,_true> has_results;
  
  has_results.super_vector<bool,_std::allocator<bool>_>.super__Bvector_base<std::allocator<bool>_>.
  _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_c8 = rsel;
  local_c0 = count;
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&result_lengths.super_vector<unsigned_long,_std::allocator<unsigned_long>_>,args->count
             ,(value_type_conflict *)&has_results,(allocator_type *)&orrified_data);
  orrified_data.
  super_unique_ptr<duckdb::UnifiedVectorFormat[],_std::default_delete<duckdb::UnifiedVectorFormat[]>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::UnifiedVectorFormat,_std::default_delete<duckdb::UnifiedVectorFormat[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::UnifiedVectorFormat_*,_std::default_delete<duckdb::UnifiedVectorFormat[]>_>
  .super__Head_base<0UL,_duckdb::UnifiedVectorFormat_*,_false>._M_head_impl._0_1_ = 0;
  ::std::vector<bool,_std::allocator<bool>_>::vector
            (&has_results.super_vector<bool,_std::allocator<bool>_>,args->count,
             (bool *)&orrified_data,&local_d1);
  make_unsafe_uniq_array_uninitialized<duckdb::UnifiedVectorFormat>
            ((duckdb *)&orrified_data,
             ((long)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                   super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                   super__Vector_impl_data._M_start) / 0x68);
  uVar16 = 1;
  lVar8 = 0;
  while( true ) {
    pVVar11 = (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
              super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
              super__Vector_impl_data._M_start;
    pVVar7 = (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
             super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if ((ulong)(((long)pVVar7 - (long)pVVar11) / 0x68) <= uVar16) break;
    this = vector<duckdb::Vector,_true>::get<true>(&args->data,uVar16);
    Vector::ToUnifiedFormat
              (this,args->count,
               (UnifiedVectorFormat *)
               (CONCAT71(orrified_data.
                         super_unique_ptr<duckdb::UnifiedVectorFormat[],_std::default_delete<duckdb::UnifiedVectorFormat[]>_>
                         ._M_t.
                         super___uniq_ptr_impl<duckdb::UnifiedVectorFormat,_std::default_delete<duckdb::UnifiedVectorFormat[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_duckdb::UnifiedVectorFormat_*,_std::default_delete<duckdb::UnifiedVectorFormat[]>_>
                         .super__Head_base<0UL,_duckdb::UnifiedVectorFormat_*,_false>._M_head_impl.
                         _1_7_,orrified_data.
                               super_unique_ptr<duckdb::UnifiedVectorFormat[],_std::default_delete<duckdb::UnifiedVectorFormat[]>_>
                               ._M_t.
                               super___uniq_ptr_impl<duckdb::UnifiedVectorFormat,_std::default_delete<duckdb::UnifiedVectorFormat[]>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_duckdb::UnifiedVectorFormat_*,_std::default_delete<duckdb::UnifiedVectorFormat[]>_>
                               .super__Head_base<0UL,_duckdb::UnifiedVectorFormat_*,_false>.
                               _M_head_impl._0_1_) + lVar8));
    uVar16 = uVar16 + 1;
    lVar8 = lVar8 + 0x48;
  }
  uVar16 = 1;
  while (uVar16 < (ulong)(((long)pVVar7 - (long)pVVar11) / 0x68)) {
    lVar6 = CONCAT71(orrified_data.
                     super_unique_ptr<duckdb::UnifiedVectorFormat[],_std::default_delete<duckdb::UnifiedVectorFormat[]>_>
                     ._M_t.
                     super___uniq_ptr_impl<duckdb::UnifiedVectorFormat,_std::default_delete<duckdb::UnifiedVectorFormat[]>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_duckdb::UnifiedVectorFormat_*,_std::default_delete<duckdb::UnifiedVectorFormat[]>_>
                     .super__Head_base<0UL,_duckdb::UnifiedVectorFormat_*,_false>._M_head_impl._1_7_
                     ,orrified_data.
                      super_unique_ptr<duckdb::UnifiedVectorFormat[],_std::default_delete<duckdb::UnifiedVectorFormat[]>_>
                      ._M_t.
                      super___uniq_ptr_impl<duckdb::UnifiedVectorFormat,_std::default_delete<duckdb::UnifiedVectorFormat[]>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_duckdb::UnifiedVectorFormat_*,_std::default_delete<duckdb::UnifiedVectorFormat[]>_>
                      .super__Head_base<0UL,_duckdb::UnifiedVectorFormat_*,_false>._M_head_impl.
                      _0_1_);
    lVar8 = lVar6 + uVar16 * 0x48;
    lVar3 = *(long *)(lVar8 + -0x40);
    local_d0 = (data_ptr_t)uVar16;
    for (sVar13 = 0; local_c0 != sVar13; sVar13 = sVar13 + 1) {
      sVar12 = sVar13;
      if (local_c8->sel_vector != (sel_t *)0x0) {
        sVar12 = (size_type)local_c8->sel_vector[sVar13];
      }
      sVar9 = sVar12;
      if (sep_sel->sel_vector != (sel_t *)0x0) {
        sVar9 = (size_type)sep_sel->sel_vector[sVar12];
      }
      lVar10 = **(long **)(lVar6 + uVar16 * 0x48 + -0x48);
      row_idx = sVar12;
      if (lVar10 != 0) {
        row_idx = (size_type)*(uint *)(lVar10 + sVar12 * 4);
      }
      bVar4 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        ((TemplatedValidityMask<unsigned_long> *)(lVar8 + -0x38),row_idx);
      if (bVar4) {
        rVar18 = vector<bool,_true>::get<true>(&has_results,sVar12);
        if ((*rVar18._M_p & rVar18._M_mask) != 0) {
          uVar1 = sep_data[sVar9].value.pointer.length;
          pvVar5 = vector<unsigned_long,_true>::get<true>(&result_lengths,sVar12);
          *pvVar5 = *pvVar5 + (ulong)uVar1;
        }
        uVar1 = *(uint *)(lVar3 + row_idx * 0x10);
        pvVar5 = vector<unsigned_long,_true>::get<true>(&result_lengths,sVar12);
        *pvVar5 = *pvVar5 + (ulong)uVar1;
        rVar18 = vector<bool,_true>::get<true>(&has_results,sVar12);
        *rVar18._M_p = *rVar18._M_p | rVar18._M_mask;
      }
    }
    pVVar11 = (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
              super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
              super__Vector_impl_data._M_start;
    pVVar7 = (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
             super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
             super__Vector_impl_data._M_finish;
    uVar16 = (long)local_d0 + 1;
  }
  pdVar17 = result->data;
  for (sVar13 = 0; local_c0 != sVar13; sVar13 = sVar13 + 1) {
    sVar12 = sVar13;
    if (local_c8->sel_vector != (sel_t *)0x0) {
      sVar12 = (size_type)local_c8->sel_vector[sVar13];
    }
    pvVar5 = vector<unsigned_long,_true>::get<true>(&result_lengths,sVar12);
    sVar19 = StringVector::EmptyString((StringVector *)result,(Vector *)*pvVar5,len);
    *(long *)(pdVar17 + sVar12 * 0x10) = sVar19.value._0_8_;
    *(long *)(pdVar17 + sVar12 * 0x10 + 8) = sVar19.value._8_8_;
    pvVar5 = vector<unsigned_long,_true>::get<true>(&result_lengths,sVar12);
    *pvVar5 = 0;
    rVar18 = vector<bool,_true>::get<true>(&has_results,sVar12);
    *rVar18._M_p = *rVar18._M_p & ~rVar18._M_mask;
  }
  local_d0 = pdVar17;
  for (uVar16 = 1;
      uVar16 < (ulong)(((long)(args->data).
                              super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                              super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(args->data).
                             super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                             super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                             _M_impl.super__Vector_impl_data._M_start) / 0x68); uVar16 = uVar16 + 1)
  {
    lVar3 = CONCAT71(orrified_data.
                     super_unique_ptr<duckdb::UnifiedVectorFormat[],_std::default_delete<duckdb::UnifiedVectorFormat[]>_>
                     ._M_t.
                     super___uniq_ptr_impl<duckdb::UnifiedVectorFormat,_std::default_delete<duckdb::UnifiedVectorFormat[]>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_duckdb::UnifiedVectorFormat_*,_std::default_delete<duckdb::UnifiedVectorFormat[]>_>
                     .super__Head_base<0UL,_duckdb::UnifiedVectorFormat_*,_false>._M_head_impl._1_7_
                     ,orrified_data.
                      super_unique_ptr<duckdb::UnifiedVectorFormat[],_std::default_delete<duckdb::UnifiedVectorFormat[]>_>
                      ._M_t.
                      super___uniq_ptr_impl<duckdb::UnifiedVectorFormat,_std::default_delete<duckdb::UnifiedVectorFormat[]>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_duckdb::UnifiedVectorFormat_*,_std::default_delete<duckdb::UnifiedVectorFormat[]>_>
                      .super__Head_base<0UL,_duckdb::UnifiedVectorFormat_*,_false>._M_head_impl.
                      _0_1_);
    lVar6 = lVar3 + uVar16 * 0x48;
    lVar8 = *(long *)(lVar6 + -0x40);
    for (pcVar15 = (char *)0x0; (char *)local_c0 != pcVar15; pcVar15 = (char *)((long)pcVar15 + 1))
    {
      sVar13 = (size_type)pcVar15;
      if (local_c8->sel_vector != (sel_t *)0x0) {
        sVar13 = (size_type)local_c8->sel_vector[(long)pcVar15];
      }
      sVar12 = sVar13;
      if (sep_sel->sel_vector != (sel_t *)0x0) {
        sVar12 = (size_type)sep_sel->sel_vector[sVar13];
      }
      lVar10 = **(long **)(lVar3 + uVar16 * 0x48 + -0x48);
      sVar9 = sVar13;
      if (lVar10 != 0) {
        sVar9 = (size_type)*(uint *)(lVar10 + sVar13 * 4);
      }
      bVar4 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        ((TemplatedValidityMask<unsigned_long> *)(lVar6 + -0x38),sVar9);
      if (bVar4) {
        rVar18 = vector<bool,_true>::get<true>(&has_results,sVar13);
        if ((*rVar18._M_p & rVar18._M_mask) != 0) {
          uVar1 = sep_data[sVar12].value.pointer.length;
          local_b8 = sep_data[sVar12].value.pointer.ptr;
          lVar10 = sVar13 * 0x10;
          local_ac = *(uint *)(pdVar17 + lVar10);
          pdVar17 = *(data_ptr_t *)(pdVar17 + lVar10 + 8);
          pvVar5 = vector<unsigned_long,_true>::get<true>(&result_lengths,sVar13);
          if (local_ac < 0xd) {
            pdVar17 = local_d0 + lVar10 + 4;
          }
          __src_00 = local_b8;
          if (uVar1 < 0xd) {
            __src_00 = (char *)((long)&sep_data[sVar12].value + 4);
          }
          switchD_016b0717::default(pdVar17 + *pvVar5,__src_00,(ulong)uVar1);
          pvVar5 = vector<unsigned_long,_true>::get<true>(&result_lengths,sVar13);
          *pvVar5 = *pvVar5 + (ulong)uVar1;
          pdVar17 = local_d0;
        }
        lVar14 = sVar9 * 0x10;
        uVar1 = *(uint *)(lVar8 + lVar14);
        __src = *(void **)(lVar8 + 8 + lVar14);
        lVar10 = sVar13 * 0x10;
        uVar2 = *(uint *)(pdVar17 + lVar10);
        pdVar17 = *(data_ptr_t *)(pdVar17 + lVar10 + 8);
        local_b8 = pcVar15;
        pvVar5 = vector<unsigned_long,_true>::get<true>(&result_lengths,sVar13);
        if (uVar2 < 0xd) {
          pdVar17 = local_d0 + lVar10 + 4;
        }
        if (uVar1 < 0xd) {
          __src = (void *)(lVar14 + lVar8 + 4);
        }
        switchD_016b0717::default(pdVar17 + *pvVar5,__src,(ulong)uVar1);
        pvVar5 = vector<unsigned_long,_true>::get<true>(&result_lengths,sVar13);
        pdVar17 = local_d0;
        *pvVar5 = *pvVar5 + (ulong)uVar1;
        rVar18 = vector<bool,_true>::get<true>(&has_results,sVar13);
        *rVar18._M_p = *rVar18._M_p | rVar18._M_mask;
        pcVar15 = local_b8;
      }
    }
  }
  for (sVar13 = 0; local_c0 != sVar13; sVar13 = sVar13 + 1) {
    sVar12 = sVar13;
    if (local_c8->sel_vector != (sel_t *)0x0) {
      sVar12 = (size_type)local_c8->sel_vector[sVar13];
    }
    string_t::Finalize((string_t *)(pdVar17 + sVar12 * 0x10));
  }
  ::std::
  unique_ptr<duckdb::UnifiedVectorFormat[],_std::default_delete<duckdb::UnifiedVectorFormat[]>_>::
  ~unique_ptr(&orrified_data.
               super_unique_ptr<duckdb::UnifiedVectorFormat[],_std::default_delete<duckdb::UnifiedVectorFormat[]>_>
             );
  ::std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            ((_Bvector_base<std::allocator<bool>_> *)&has_results);
  ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&result_lengths);
  return;
}

Assistant:

static void TemplatedConcatWS(DataChunk &args, const string_t *sep_data, const SelectionVector &sep_sel,
                              const SelectionVector &rsel, idx_t count, Vector &result) {
	vector<idx_t> result_lengths(args.size(), 0);
	vector<bool> has_results(args.size(), false);

	// we overallocate here, but this is important for static analysis
	auto orrified_data = make_unsafe_uniq_array_uninitialized<UnifiedVectorFormat>(args.ColumnCount());

	for (idx_t col_idx = 1; col_idx < args.ColumnCount(); col_idx++) {
		args.data[col_idx].ToUnifiedFormat(args.size(), orrified_data[col_idx - 1]);
	}

	// first figure out the lengths
	for (idx_t col_idx = 1; col_idx < args.ColumnCount(); col_idx++) {
		auto &idata = orrified_data[col_idx - 1];

		auto input_data = UnifiedVectorFormat::GetData<string_t>(idata);
		for (idx_t i = 0; i < count; i++) {
			auto ridx = rsel.get_index(i);
			auto sep_idx = sep_sel.get_index(ridx);
			auto idx = idata.sel->get_index(ridx);
			if (!idata.validity.RowIsValid(idx)) {
				continue;
			}
			if (has_results[ridx]) {
				result_lengths[ridx] += sep_data[sep_idx].GetSize();
			}
			result_lengths[ridx] += input_data[idx].GetSize();
			has_results[ridx] = true;
		}
	}

	// first we allocate the empty strings for each of the values
	auto result_data = FlatVector::GetData<string_t>(result);
	for (idx_t i = 0; i < count; i++) {
		auto ridx = rsel.get_index(i);
		// allocate an empty string of the required size
		result_data[ridx] = StringVector::EmptyString(result, result_lengths[ridx]);
		// we reuse the result_lengths vector to store the currently appended size
		result_lengths[ridx] = 0;
		has_results[ridx] = false;
	}

	// now that the empty space for the strings has been allocated, perform the concatenation
	for (idx_t col_idx = 1; col_idx < args.ColumnCount(); col_idx++) {
		auto &idata = orrified_data[col_idx - 1];
		auto input_data = UnifiedVectorFormat::GetData<string_t>(idata);
		for (idx_t i = 0; i < count; i++) {
			auto ridx = rsel.get_index(i);
			auto sep_idx = sep_sel.get_index(ridx);
			auto idx = idata.sel->get_index(ridx);
			if (!idata.validity.RowIsValid(idx)) {
				continue;
			}
			if (has_results[ridx]) {
				auto sep_size = sep_data[sep_idx].GetSize();
				auto sep_ptr = sep_data[sep_idx].GetData();
				memcpy(result_data[ridx].GetDataWriteable() + result_lengths[ridx], sep_ptr, sep_size);
				result_lengths[ridx] += sep_size;
			}
			auto input_ptr = input_data[idx].GetData();
			auto input_len = input_data[idx].GetSize();
			memcpy(result_data[ridx].GetDataWriteable() + result_lengths[ridx], input_ptr, input_len);
			result_lengths[ridx] += input_len;
			has_results[ridx] = true;
		}
	}
	for (idx_t i = 0; i < count; i++) {
		auto ridx = rsel.get_index(i);
		result_data[ridx].Finalize();
	}
}